

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O0

int expbuf_read(expbuf_t *buf,int fd)

{
  int iVar1;
  size_t local_28;
  size_t sz;
  expbuf_t *peStack_18;
  int fd_local;
  expbuf_t *buf_local;
  
  sz._4_4_ = fd;
  peStack_18 = buf;
  iVar1 = read_nbytes(fd,&local_28,8);
  if (iVar1 == 0) {
    expbuf_reserve(peStack_18,local_28);
    iVar1 = read_nbytes(sz._4_4_,peStack_18->end,local_28);
    if (iVar1 == 0) {
      peStack_18->end = peStack_18->end + local_28;
      buf_local._4_4_ = 0;
    }
    else {
      buf_local._4_4_ = -1;
    }
  }
  else {
    buf_local._4_4_ = -1;
  }
  return buf_local._4_4_;
}

Assistant:

static int expbuf_read(struct expbuf_t *buf, int fd)
{
    size_t sz;

    if (read_nbytes(fd, &sz, sizeof(sz)) != 0)
        return -1;
    expbuf_reserve(buf, sz);
    if (read_nbytes(fd, buf->end, sz) != 0)
        return -1;
    buf->end += sz;
    return 0;
}